

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O2

int resolve_augment(lys_node_augment *aug,lys_node *uses,unres_schema *unres)

{
  ly_ctx *ctx;
  int iVar1;
  lys_module *plVar2;
  lys_module *plVar3;
  lys_module *plVar4;
  char *pcVar5;
  lys_node **pplVar6;
  LYS_NODE LVar7;
  char *pcVar8;
  lys_node *plVar9;
  ly_set *local_40;
  ly_set *set;
  
  set = (ly_set *)unres;
  if (aug == (lys_node_augment *)0x0) {
    __assert_fail("aug",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x1299,
                  "int resolve_augment(struct lys_node_augment *, struct lys_node *, struct unres_schema *)"
                 );
  }
  plVar2 = lys_main_module(aug->module);
  ctx = plVar2->ctx;
  aug->flags = aug->flags | 1;
  if (aug->target == (lys_node *)0x0) {
    pcVar5 = aug->target_name;
    if (uses == (lys_node *)0x0) {
      plVar3 = lys_node_module((lys_node *)aug);
    }
    else {
      plVar3 = (lys_module *)0x0;
    }
    iVar1 = resolve_schema_nodeid(pcVar5,uses,plVar3,&local_40,0,0);
    if (iVar1 == -1) {
      ly_vlog(ctx,LYE_PATH,LY_VLOG_LYS,aug);
      return -1;
    }
    if (local_40 == (ly_set *)0x0) {
      ly_vlog(ctx,LYE_INRESOLV,LY_VLOG_LYS,aug,"augment",aug->target_name);
      return 1;
    }
    aug->target = *(local_40->set).s;
    ly_set_free(local_40);
  }
  if (((plVar2->field_0x40 & 0x80) != 0) &&
     (plVar3 = lys_node_module(aug->target), (plVar3->field_0x40 & 0x80) == 0)) {
    plVar3 = lys_node_module(aug->target);
    plVar3->field_0x40 = plVar3->field_0x40 | 0x80;
    plVar3 = lys_node_module(aug->target);
    iVar1 = unres_schema_add_node
                      (plVar3,(unres_schema *)set,(void *)0x0,UNRES_MOD_IMPLEMENT,(lys_node *)0x0);
    if (iVar1 == -1) {
      return -1;
    }
  }
  if (aug->parent == (lys_node *)0x0) {
    plVar3 = lys_node_module((lys_node *)aug);
    plVar4 = lys_node_module(aug->target);
    if ((plVar3 != plVar4) && (iVar1 = lyp_check_mandatory_augment(aug,aug->target), iVar1 != 0)) {
      return iVar1;
    }
  }
  LVar7 = aug->target->nodetype;
  if ((LVar7 & (LYS_LIST|LYS_CONTAINER)) == LYS_UNKNOWN) {
    if ((LVar7 & (LYS_OUTPUT|LYS_INPUT|LYS_NOTIF|LYS_CASE)) == LYS_UNKNOWN) {
      if (LVar7 != LYS_CHOICE) {
        ly_vlog(ctx,LYE_INARG,LY_VLOG_LYS,aug,aug->target_name,"target-node");
        pcVar5 = strnodetype(aug->target->nodetype);
        pcVar8 = "Invalid augment target node type \"%s\".";
        goto LAB_0011d90e;
      }
      pplVar6 = &aug->child;
      while (plVar9 = *pplVar6, plVar9 != (lys_node *)0x0) {
        LVar7 = plVar9->nodetype;
        if ((LVar7 & 0x807d) == LYS_UNKNOWN) goto LAB_0011d8b7;
        pplVar6 = &plVar9->next;
      }
    }
    else {
      pplVar6 = &aug->child;
      while (plVar9 = *pplVar6, plVar9 != (lys_node *)0x0) {
        LVar7 = plVar9->nodetype;
        if ((LVar7 & 0x903f) == LYS_UNKNOWN) goto LAB_0011d8b7;
        pplVar6 = &plVar9->next;
      }
    }
  }
  else {
    pplVar6 = &aug->child;
    while (plVar9 = *pplVar6, plVar9 != (lys_node *)0x0) {
      LVar7 = plVar9->nodetype;
      if ((LVar7 & 0xd0bf) == LYS_UNKNOWN) goto LAB_0011d8b7;
      pplVar6 = &plVar9->next;
    }
  }
  pplVar6 = &aug->child;
  while (plVar9 = *pplVar6, plVar9 != (lys_node *)0x0) {
    iVar1 = lys_check_id(plVar9,aug->target,(lys_module *)0x0);
    pplVar6 = &plVar9->next;
    if (iVar1 != 0) {
      return -1;
    }
  }
  if (aug->child == (lys_node *)0x0) {
    ly_log(ctx,LY_LLWRN,LY_SUCCESS,"Augment \"%s\" without children.",aug->target_name);
    *(byte *)&aug->flags = (byte)aug->flags & 0xfe;
  }
  else if (((aug->parent != (lys_node *)0x0) || ((plVar2->field_0x40 & 0x80) != 0)) &&
          (iVar1 = apply_aug(aug,(unres_schema *)set), iVar1 != 0)) {
    return -1;
  }
  return 0;
LAB_0011d8b7:
  pcVar5 = strnodetype(LVar7);
  ly_vlog(ctx,LYE_INCHILDSTMT,LY_VLOG_LYS,aug,pcVar5,"augment");
  pcVar5 = strnodetype(aug->target->nodetype);
  strnodetype(plVar9->nodetype);
  pcVar8 = "Cannot augment \"%s\" with a \"%s\".";
LAB_0011d90e:
  ly_vlog(ctx,LYE_SPEC,LY_VLOG_PREV,(void *)0x0,pcVar8,pcVar5);
  return -1;
}

Assistant:

static int
resolve_augment(struct lys_node_augment *aug, struct lys_node *uses, struct unres_schema *unres)
{
    int rc;
    struct lys_node *sub;
    struct lys_module *mod;
    struct ly_set *set;
    struct ly_ctx *ctx;

    assert(aug);
    mod = lys_main_module(aug->module);
    ctx = mod->ctx;

    /* set it as not applied for now */
    aug->flags |= LYS_NOTAPPLIED;

    /* it can already be resolved in case we returned EXIT_FAILURE from if block below */
    if (!aug->target) {
        /* resolve target node */
        rc = resolve_schema_nodeid(aug->target_name, uses, (uses ? NULL : lys_node_module((struct lys_node *)aug)), &set, 0, 0);
        if (rc == -1) {
            LOGVAL(ctx, LYE_PATH, LY_VLOG_LYS, aug);
            return -1;
        }
        if (!set) {
            LOGVAL(ctx, LYE_INRESOLV, LY_VLOG_LYS, aug, "augment", aug->target_name);
            return EXIT_FAILURE;
        }
        aug->target = set->set.s[0];
        ly_set_free(set);
    }

    /* make this module implemented if the target module is (if the target is in an unimplemented module,
     * it is fine because when we will be making that module implemented, its augment will be applied
     * and that augment target module made implemented, recursively) */
    if (mod->implemented && !lys_node_module(aug->target)->implemented) {
        lys_node_module(aug->target)->implemented = 1;
        if (unres_schema_add_node(lys_node_module(aug->target), unres, NULL, UNRES_MOD_IMPLEMENT, NULL) == -1) {
            return -1;
        }
    }

    /* check for mandatory nodes - if the target node is in another module
     * the added nodes cannot be mandatory
     */
    if (!aug->parent && (lys_node_module((struct lys_node *)aug) != lys_node_module(aug->target))
            && (rc = lyp_check_mandatory_augment(aug, aug->target))) {
        return rc;
    }

    /* check augment target type and then augment nodes type */
    if (aug->target->nodetype & (LYS_CONTAINER | LYS_LIST)) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_USES
                                   | LYS_CHOICE | LYS_ACTION | LYS_NOTIF))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else if (aug->target->nodetype & (LYS_CASE | LYS_INPUT | LYS_OUTPUT | LYS_NOTIF)) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST | LYS_USES | LYS_CHOICE))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else if (aug->target->nodetype == LYS_CHOICE) {
        LY_TREE_FOR(aug->child, sub) {
            if (!(sub->nodetype & (LYS_CASE | LYS_ANYDATA | LYS_CONTAINER | LYS_LEAF | LYS_LIST | LYS_LEAFLIST))) {
                LOGVAL(ctx, LYE_INCHILDSTMT, LY_VLOG_LYS, aug, strnodetype(sub->nodetype), "augment");
                LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Cannot augment \"%s\" with a \"%s\".",
                       strnodetype(aug->target->nodetype), strnodetype(sub->nodetype));
                return -1;
            }
        }
    } else {
        LOGVAL(ctx, LYE_INARG, LY_VLOG_LYS, aug, aug->target_name, "target-node");
        LOGVAL(ctx, LYE_SPEC, LY_VLOG_PREV, NULL, "Invalid augment target node type \"%s\".", strnodetype(aug->target->nodetype));
        return -1;
    }

    /* check identifier uniqueness as in lys_node_addchild() */
    LY_TREE_FOR(aug->child, sub) {
        if (lys_check_id(sub, aug->target, NULL)) {
            return -1;
        }
    }

    if (!aug->child) {
        /* empty augment, nothing to connect, but it is techincally applied */
        LOGWRN(ctx, "Augment \"%s\" without children.", aug->target_name);
        aug->flags &= ~LYS_NOTAPPLIED;
    } else if ((aug->parent || mod->implemented) && apply_aug(aug, unres)) {
        /* we try to connect the augment only in case the module is implemented or
         * the augment applies on the used grouping, anyway we failed here */
        return -1;
    }

    return EXIT_SUCCESS;
}